

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O1

void helper_dsub(CPUPPCState_conflict *env,ppc_fprp_t *t,ppc_fprp_t *a,ppc_fprp_t *b)

{
  PPC_DFP dfp;
  undefined1 auStack_f8 [16];
  ppc_vsr_t local_e8 [3];
  decNumber_conflict2 local_b8;
  decNumber_conflict local_94 [3];
  decNumber_conflict local_70 [3];
  decContext local_4c;
  
  dfp_prepare_decimal64((PPC_DFP *)auStack_f8,a,b,env);
  decNumberSubtract((decNumber_conflict *)(auStack_f8 + 0x40),local_94,local_70,&local_4c);
  decimal64FromNumber((decimal64 *)(auStack_f8 + 0x10),(decNumber_conflict2 *)(auStack_f8 + 0x40),
                      &local_4c);
  SUB_PPs((PPC_DFP *)auStack_f8);
  t->u64[1] = local_e8[0].u64[0];
  return;
}

Assistant:

static void MUL_PPs(struct PPC_DFP *dfp)
{
    dfp_set_FPRF_from_FRT(dfp);
    dfp_check_for_OX(dfp);
    dfp_check_for_UX(dfp);
    dfp_check_for_XX(dfp);
    dfp_check_for_VXSNAN(dfp);
    dfp_check_for_VXIMZ(dfp);
}